

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_smooth.c
# Opt level: O1

REF_STATUS ref_smooth_tet_nso(REF_GRID ref_grid,REF_INT node)

{
  REF_ADJ pRVar1;
  REF_NODE pRVar2;
  REF_CELL ref_cell;
  REF_ADJ_ITEM pRVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  double *pdVar9;
  double *pdVar10;
  ulong uVar11;
  double *pdVar12;
  undefined8 uVar13;
  double dVar14;
  REF_DBL *pRVar15;
  REF_INTERP pRVar16;
  ulong uVar17;
  REF_DBL *pRVar18;
  long lVar19;
  ulong uVar20;
  char *pcVar21;
  double dVar22;
  long lVar23;
  long lVar24;
  int iVar25;
  REF_INT RVar26;
  long lVar27;
  ulong uVar28;
  int *__ptr;
  int iVar29;
  bool bVar30;
  double dVar31;
  REF_DBL RVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  REF_INT degree;
  REF_DBL quality;
  REF_DBL dir [3];
  REF_BOOL allowed;
  REF_DBL d_quality [3];
  REF_DBL N [16];
  REF_DBL NtinvNNtN [16];
  REF_DBL NtinvNNt [16];
  REF_DBL NNt [16];
  REF_INT nodes [27];
  REF_DBL invNNt [16];
  uint local_4ac;
  ulong local_4a8;
  uint local_49c;
  REF_GRID local_498;
  REF_DBL local_490;
  double local_488;
  REF_DBL local_480;
  REF_DBL local_478;
  REF_DBL local_470;
  int *local_468;
  double *local_460;
  double local_458;
  double dStack_450;
  double local_448;
  REF_NODE local_438;
  long local_430;
  long local_428;
  long local_420;
  double local_418;
  uint local_410;
  REF_INT local_40c;
  double local_408;
  long local_400;
  double local_3f8;
  double local_3f0;
  double local_3e8;
  ulong local_3e0;
  REF_INTERP local_3d8;
  int local_3cc;
  double local_3c8;
  double local_3c0;
  double local_3b8;
  double local_3a8 [16];
  double local_328 [16];
  double local_2a8 [16];
  double local_228 [16];
  REF_DBL local_1a8 [16];
  REF_INT local_128 [28];
  REF_DBL local_b8 [17];
  
  uVar11 = (ulong)(uint)node;
  local_498 = ref_grid;
  ref_smooth_local_cell_about(ref_grid->cell[8],ref_grid->node,node,&local_3cc);
  if ((local_3cc == 0) ||
     ((-1 < node &&
      (((pRVar1 = local_498->cell[3]->ref_adj, node < pRVar1->nnode &&
        (pRVar1->first[(uint)node] != -1)) ||
       ((pRVar1 = local_498->cell[6]->ref_adj, node < pRVar1->nnode &&
        (pRVar1->first[(uint)node] != -1)))))))) {
    return 0;
  }
  local_420 = (long)(node * 0xf);
  local_428 = (long)(node * 0xf + 1);
  local_430 = (long)(node * 0xf + 2);
  local_400 = (long)node;
  local_3e0 = (ulong)(uint)node;
  iVar29 = 0;
LAB_001f7573:
  pRVar2 = local_498->node;
  ref_cell = local_498->cell[8];
  local_490 = 0.0;
  pRVar16 = local_498->interp;
  RVar26 = -1;
  if ((pRVar16 != (REF_INTERP)0x0) && (pRVar16->continuously != 0)) {
    RVar26 = pRVar16->cell[local_400];
  }
  pRVar18 = pRVar2->real;
  local_470 = pRVar18[local_420];
  local_478 = pRVar18[local_428];
  local_480 = pRVar18[local_430];
  iVar25 = (int)uVar11;
  uVar5 = ref_adj_degree(ref_cell->ref_adj,iVar25,(REF_INT *)&local_4ac);
  uVar6 = local_4ac;
  if (uVar5 == 0) {
    lVar27 = (long)(int)local_4ac;
    local_438 = pRVar2;
    local_40c = RVar26;
    if (lVar27 < 0) {
      bVar30 = false;
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
             0x804,"ref_smooth_tet_nso_step","malloc cells of REF_INT negative");
      uVar5 = 1;
      goto LAB_001f7e19;
    }
    local_468 = (int *)malloc(lVar27 * 4);
    if (local_468 == (int *)0x0) {
      uVar13 = 0x805;
      pcVar21 = "malloc active of REF_INT NULL";
LAB_001f799e:
      bVar30 = false;
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
             uVar13,"ref_smooth_tet_nso_step",pcVar21);
      uVar5 = 2;
      goto LAB_001f7e19;
    }
    pdVar9 = (double *)malloc(lVar27 * 8);
    if (pdVar9 == (double *)0x0) {
      uVar13 = 0x806;
      pcVar21 = "malloc quals of REF_DBL NULL";
      goto LAB_001f799e;
    }
    local_460 = pdVar9;
    pdVar9 = (double *)malloc((ulong)(uVar6 * 3) << 3);
    if (pdVar9 == (double *)0x0) {
      uVar13 = 0x807;
      pcVar21 = "malloc grads of REF_DBL NULL";
      goto LAB_001f799e;
    }
    local_4ac = 0;
    RVar26 = -1;
    uVar28 = 0xffffffff;
    if (-1 < iVar25) {
      uVar28 = 0xffffffff;
      if (iVar25 < ref_cell->ref_adj->nnode) {
        uVar28 = (ulong)(uint)ref_cell->ref_adj->first[local_3e0];
      }
    }
    iVar25 = (int)uVar28;
    dVar31 = 1.0;
    if (iVar25 != -1) {
      RVar26 = ref_cell->ref_adj->item[iVar25].ref;
    }
    dVar22 = 2.12199579047121e-314;
    local_4a8 = uVar11;
    if (iVar25 == -1) {
      dVar31 = 1.0;
    }
    else {
      do {
        local_3d8 = pRVar16;
        local_488 = dVar31;
        uVar6 = ref_cell_nodes(ref_cell,RVar26,local_128);
        if (uVar6 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
                 0x80d,"ref_smooth_tet_nso_step",(ulong)uVar6,"nodes");
          uVar5 = uVar6;
          goto LAB_001f7e11;
        }
        uVar6 = ref_cell_orient_node0(4,(REF_INT)local_4a8,local_128);
        if (uVar6 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
                 0x80e,"ref_smooth_tet_nso_step",(ulong)uVar6,"orient");
          uVar5 = uVar6;
          goto LAB_001f7e11;
        }
        uVar6 = ref_node_tet_dquality_dnode0(local_438,local_128,&local_490,&local_3c8);
        if (uVar6 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
                 0x810,"ref_smooth_tet_nso_step",(ulong)uVar6,"qual");
          uVar5 = uVar6;
          goto LAB_001f7e11;
        }
        bVar30 = SUB84(dVar22,0) != -1;
        dVar31 = local_490;
        if (bVar30 && local_488 <= local_490) {
          dVar31 = local_488;
        }
        lVar27 = (long)(int)local_4ac;
        if (!bVar30 || local_488 > local_490) {
          dVar22 = (double)(ulong)local_4ac;
        }
        local_460[lVar27] = local_490;
        pdVar9[lVar27 * 3] = local_3c8;
        pdVar9[lVar27 * 3 + 1] = local_3c0;
        pdVar9[lVar27 * 3 + 2] = local_3b8;
        local_4ac = local_4ac + 1;
        pRVar3 = ref_cell->ref_adj->item;
        iVar25 = pRVar3[(int)uVar28].next;
        uVar28 = (ulong)iVar25;
        if (uVar28 == 0xffffffffffffffff) {
          RVar26 = -1;
        }
        else {
          RVar26 = pRVar3[uVar28].ref;
        }
        pRVar16 = local_3d8;
      } while (iVar25 != -1);
    }
    *local_468 = SUB84(dVar22,0);
    bVar30 = true;
    uVar6 = 1;
    if (0 < (long)(int)local_4ac) {
      uVar6 = 1;
      dVar14 = 0.0;
      do {
        if ((dVar22 != dVar14) && (local_460[(long)dVar14] - local_460[*local_468] < 1e-12)) {
          local_468[(int)uVar6] = SUB84(dVar14,0);
          uVar6 = uVar6 + 1;
        }
        dVar14 = (double)((long)dVar14 + 1);
      } while ((double)(long)(int)local_4ac != dVar14);
    }
    __ptr = local_468;
    if ((int)uVar6 < 4) {
      local_488 = dVar22;
      local_408 = dVar31;
      if (uVar6 == 1) {
        lVar27 = (long)(SUB84(dVar22,0) * 3);
        local_458 = pdVar9[lVar27];
        dStack_450 = pdVar9[lVar27 + 1];
        local_448 = pdVar9[lVar27 + 2];
LAB_001f7dc3:
        __ptr = local_468;
        uVar7 = ref_math_normalize(&local_458);
        if (uVar7 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
                 0x861,"ref_smooth_tet_nso_step",(ulong)uVar7,"norm");
          uVar5 = uVar7;
          goto LAB_001f7e11;
        }
        lVar27 = (long)(SUB84(local_488,0) * 3);
        dVar31 = pdVar9[lVar27 + 2] * local_448 +
                 pdVar9[lVar27] * local_458 + pdVar9[lVar27 + 1] * dStack_450;
        if (dVar31 <= 0.0) {
          printf("%s: %d: %s: m0 not positive %e",dVar31,
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
                 0x868,"ref_smooth_tet_nso_step");
          bVar30 = true;
          goto LAB_001f7a14;
        }
        uVar11 = (ulong)(int)local_4ac;
        local_488 = (double)(long)SUB84(local_488,0);
        if ((long)uVar11 < 1) {
          bVar30 = true;
          dVar22 = 10000000000.0;
        }
        else {
          uVar28 = 0xffffffff;
          uVar17 = 0;
          dVar22 = 10000000000.0;
          do {
            if ((int)uVar6 < 1) {
LAB_001f7f25:
              dVar34 = (pdVar9[uVar17 * 3 + 2] * local_448 +
                       pdVar9[uVar17 * 3] * local_458 + pdVar9[uVar17 * 3 + 1] * dStack_450) -
                       dVar31;
              dVar14 = dVar34 * 1e+20;
              if (dVar14 <= -dVar14) {
                dVar14 = -dVar14;
              }
              dVar33 = local_460[(long)local_488] - local_460[uVar17];
              dVar35 = dVar33;
              if (dVar33 <= -dVar33) {
                dVar35 = -dVar33;
              }
              if ((dVar35 < dVar14) && (dVar33 = dVar33 / dVar34, 0.0 < dVar33 && dVar33 < dVar22))
              {
                uVar28 = uVar17 & 0xffffffff;
                dVar22 = dVar33;
              }
            }
            else {
              uVar20 = 0;
              bVar30 = false;
              do {
                if (uVar17 == (uint)__ptr[uVar20]) {
                  bVar30 = true;
                }
                uVar20 = uVar20 + 1;
              } while (uVar6 != uVar20);
              if (!bVar30) goto LAB_001f7f25;
            }
            uVar17 = uVar17 + 1;
          } while (uVar17 != uVar11);
          bVar30 = (int)uVar28 == -1;
        }
        if ((bVar30) &&
           (dVar22 = (1.0 - *local_460) /
                     (pdVar9[2] * local_448 + *pdVar9 * local_458 + pdVar9[1] * dStack_450),
           1 < (int)local_4ac)) {
          pdVar10 = pdVar9 + 5;
          uVar28 = 1;
          do {
            dVar14 = (1.0 - local_460[uVar28]) /
                     (*pdVar10 * local_448 + pdVar10[-2] * local_458 + pdVar10[-1] * dStack_450);
            if (dVar14 <= dVar22) {
              dVar22 = dVar14;
            }
            uVar28 = uVar28 + 1;
            pdVar10 = pdVar10 + 3;
          } while (uVar11 != uVar28);
        }
        local_3e8 = 0.0;
        local_418 = 0.0;
        uVar7 = 0;
        local_3f0 = dVar31;
        while( true ) {
          uVar11 = local_4a8;
          pRVar18 = local_438->real;
          pRVar18[local_420] = local_458 * dVar22 + local_470;
          pRVar18[local_428] = dStack_450 * dVar22 + local_478;
          pRVar18[local_430] = local_448 * dVar22 + local_480;
          RVar26 = (REF_INT)local_4a8;
          local_3f8 = local_3e8;
          local_3e8 = dVar22;
          uVar8 = ref_metric_interpolate_node(local_498,RVar26);
          if ((uVar8 != 0) && (uVar8 != 5)) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                   ,0x89a,"ref_smooth_tet_nso_step",(ulong)uVar8,
                   "ref_metric_interpolate_node failed");
            uVar5 = uVar8;
          }
          if ((uVar8 != 5) && (uVar8 != 0)) {
            bVar30 = false;
            goto LAB_001f7e19;
          }
          local_410 = uVar8;
          uVar8 = ref_smooth_tet_quality_around(local_498,RVar26,&local_490);
          uVar11 = local_4a8;
          if (uVar8 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                   ,0x89c,"ref_smooth_tet_nso_step",(ulong)uVar8,"rep");
            uVar5 = uVar8;
            goto LAB_001f7e11;
          }
          if (((uVar7 != 0 && local_410 == 0) && (local_490 < local_418)) && (local_408 < local_490)
             ) break;
          local_418 = local_490;
          if ((local_3e8 * 0.9 * local_3f0 + local_460[(long)local_488] < local_490) ||
             (local_3e8 < 1e-12)) goto LAB_001f82cb;
          dVar22 = local_3e8 * 0.5;
          uVar7 = uVar7 + 1;
          if (uVar7 == 8) goto code_r0x001f82bc;
        }
        local_490 = local_418;
        pRVar18 = local_438->real;
        pRVar18[local_420] = local_458 * local_3f8 + local_470;
        pRVar18[local_428] = dStack_450 * local_3f8 + local_478;
        pRVar18[local_430] = local_3f8 * local_448 + local_480;
        uVar8 = ref_metric_interpolate_node(local_498,(REF_INT)local_4a8);
        local_49c = uVar7;
        if ((uVar8 != 0) && (uVar8 != 5)) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
                 0x8ab,"ref_smooth_tet_nso_step",(ulong)uVar8,"interp");
          uVar5 = uVar8;
        }
        bVar30 = false;
        if ((uVar8 != 0) && (uVar8 != 5)) goto LAB_001f7e19;
        goto LAB_001f82d5;
      }
      if (0 < (int)uVar6) {
        uVar11 = (ulong)uVar6;
        pdVar10 = local_3a8 + uVar11;
        uVar28 = 0;
        do {
          local_3a8[uVar28] = 1.0;
          iVar25 = local_468[uVar28];
          lVar27 = 0;
          pdVar12 = pdVar10;
          do {
            lVar19 = (long)iVar25 * 3 + lVar27;
            lVar27 = lVar27 + 1;
            *pdVar12 = -pdVar9[lVar19];
            pdVar12 = pdVar12 + uVar11;
          } while (lVar27 != 3);
          uVar28 = uVar28 + 1;
          pdVar10 = pdVar10 + 1;
        } while (uVar28 != uVar11);
        if (0 < (int)uVar6) {
          pRVar18 = local_1a8;
          uVar17 = 0;
          uVar28 = uVar11;
          pRVar15 = pRVar18;
          do {
            do {
              *pRVar18 = 0.0;
              pRVar18 = pRVar18 + uVar11;
              uVar28 = uVar28 - 1;
            } while (uVar28 != 0);
            uVar17 = uVar17 + 1;
            pRVar18 = pRVar15 + 1;
            uVar28 = uVar11;
            pRVar15 = pRVar18;
          } while (uVar17 != uVar11);
          if (0 < (int)uVar6) {
            lVar27 = 0;
            uVar28 = 0;
            do {
              lVar19 = 0;
              uVar17 = 0;
              do {
                lVar23 = uVar17 * uVar11 + uVar28;
                RVar32 = local_1a8[lVar23];
                lVar24 = 4;
                pdVar10 = local_3a8;
                do {
                  RVar32 = RVar32 + *(double *)((long)pdVar10 + lVar27) *
                                    *(double *)((long)pdVar10 + lVar19);
                  pdVar10 = pdVar10 + uVar11;
                  lVar24 = lVar24 + -1;
                } while (lVar24 != 0);
                local_1a8[lVar23] = RVar32;
                uVar17 = uVar17 + 1;
                lVar19 = lVar19 + 8;
              } while (uVar17 != uVar11);
              uVar28 = uVar28 + 1;
              lVar27 = lVar27 + 8;
            } while (uVar28 != uVar11);
          }
        }
      }
      uVar7 = ref_matrix_inv_gen(uVar6,local_1a8,local_b8);
      if (uVar7 == 0) {
        uVar11 = (ulong)uVar6;
        pdVar10 = local_228;
        lVar27 = 0;
        do {
          if (0 < (int)uVar6) {
            lVar19 = 0;
            do {
              *(undefined8 *)((long)pdVar10 + lVar19) = 0;
              lVar19 = lVar19 + 0x20;
            } while (uVar11 << 5 != lVar19);
          }
          lVar27 = lVar27 + 1;
          pdVar10 = pdVar10 + 1;
        } while (lVar27 != 4);
        uVar28 = 0;
        lVar27 = 0;
        do {
          if (0 < (int)uVar6) {
            uVar17 = 0;
            pRVar18 = local_b8;
            do {
              lVar19 = lVar27 + uVar17 * 4;
              dVar31 = local_228[lVar19];
              uVar20 = 0;
              do {
                dVar31 = dVar31 + local_3a8[uVar28 + uVar20] * pRVar18[uVar20];
                uVar20 = uVar20 + 1;
              } while (uVar11 != uVar20);
              local_228[lVar19] = dVar31;
              uVar17 = uVar17 + 1;
              pRVar18 = pRVar18 + uVar11;
            } while (uVar17 != uVar11);
          }
          lVar27 = lVar27 + 1;
          uVar28 = (ulong)((int)uVar28 + uVar6);
        } while (lVar27 != 4);
        pdVar10 = local_2a8;
        lVar27 = 0;
        do {
          lVar19 = 0;
          do {
            *(undefined8 *)((long)pdVar10 + lVar19) = 0;
            lVar19 = lVar19 + 0x20;
          } while (lVar19 != 0x80);
          lVar27 = lVar27 + 1;
          pdVar10 = pdVar10 + 1;
        } while (lVar27 != 4);
        pdVar10 = local_228;
        lVar27 = 0;
        do {
          lVar19 = 0;
          pdVar12 = local_3a8;
          do {
            if (0 < (int)uVar6) {
              lVar23 = lVar27 + lVar19 * 4;
              dVar31 = local_2a8[lVar23];
              lVar24 = 0;
              do {
                dVar31 = dVar31 + *(double *)((long)pdVar10 + lVar24 * 4) *
                                  *(double *)((long)pdVar12 + lVar24);
                lVar24 = lVar24 + 8;
              } while (uVar11 * 8 - lVar24 != 0);
              local_2a8[lVar23] = dVar31;
            }
            lVar19 = lVar19 + 1;
            pdVar12 = pdVar12 + uVar11;
          } while (lVar19 != 4);
          lVar27 = lVar27 + 1;
          pdVar10 = pdVar10 + 1;
        } while (lVar27 != 4);
        pdVar10 = local_2a8;
        pdVar12 = local_328;
        lVar27 = 0;
        do {
          lVar19 = 0;
          do {
            *(ulong *)((long)pdVar12 + lVar19) =
                 *(ulong *)((long)pdVar10 + lVar19) ^ 0x8000000000000000;
            lVar19 = lVar19 + 0x20;
          } while (lVar19 != 0x80);
          lVar27 = lVar27 + 1;
          pdVar12 = pdVar12 + 1;
          pdVar10 = pdVar10 + 1;
        } while (lVar27 != 4);
        lVar27 = 0;
        do {
          *(double *)((long)local_328 + lVar27) = *(double *)((long)local_328 + lVar27) + 1.0;
          lVar27 = lVar27 + 0x28;
        } while (lVar27 != 0xa0);
        local_448 = local_328[3];
        local_458 = local_328[1];
        dStack_450 = local_328[2];
        goto LAB_001f7dc3;
      }
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
             0x848,"ref_smooth_tet_nso_step");
      uVar5 = uVar7;
      goto LAB_001f7e11;
    }
    goto LAB_001f7a14;
  }
  bVar30 = false;
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",0x802,
         "ref_smooth_tet_nso_step",(ulong)uVar5,"deg");
  goto LAB_001f7e19;
code_r0x001f82bc:
  local_49c = 8;
  uVar7 = local_49c;
LAB_001f82cb:
  local_49c = uVar7;
  bVar30 = local_410 != 0;
LAB_001f82d5:
  bVar4 = false;
  if (7 < local_49c) {
    pRVar18 = local_438->real;
    pRVar18[local_420] = local_470;
    pRVar18[local_428] = local_478;
    pRVar18[local_430] = local_480;
    if ((bool)(bVar30 & local_40c != -1)) {
      pRVar16->cell[local_400] = local_40c;
    }
    uVar7 = ref_metric_interpolate_node(local_498,(REF_INT)local_4a8);
    if ((uVar7 != 0) && (uVar7 != 5)) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
             0x8bb,"ref_smooth_tet_nso_step",(ulong)uVar7,"interp");
      uVar5 = uVar7;
    }
    bVar4 = true;
    if ((uVar7 != 5) && (uVar7 != 0)) {
LAB_001f7e11:
      bVar30 = false;
      uVar11 = local_4a8;
      goto LAB_001f7e19;
    }
  }
  bVar30 = bVar4;
  __ptr = local_468;
  if ((uVar6 == 3) && (local_490 - local_408 < 1e-05)) {
    bVar30 = true;
  }
LAB_001f7a14:
  free(pdVar9);
  free(local_460);
  free(__ptr);
  uVar5 = 0;
  uVar11 = local_4a8;
LAB_001f7e19:
  if (uVar5 == 0) {
    uVar6 = 0;
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",0x8dd,
           "ref_smooth_tet_nso",(ulong)uVar5,"step");
    uVar6 = uVar5;
  }
  if (!(bool)(~bVar30 & uVar5 == 0)) {
    return uVar6;
  }
  iVar29 = iVar29 + 1;
  if (iVar29 == 100) {
    return 0;
  }
  goto LAB_001f7573;
}

Assistant:

REF_FCN REF_STATUS ref_smooth_tet_nso(REF_GRID ref_grid, REF_INT node) {
  REF_BOOL allowed, interior;
  REF_BOOL complete = REF_FALSE;
  REF_INT step;

  RSS(ref_smooth_local_cell_about(ref_grid_tet(ref_grid),
                                  ref_grid_node(ref_grid), node, &allowed),
      "para");
  if (!allowed) return REF_SUCCESS;

  interior = ref_cell_node_empty(ref_grid_tri(ref_grid), node) &&
             ref_cell_node_empty(ref_grid_qua(ref_grid), node);
  if (!interior) return REF_SUCCESS;

  for (step = 0; step < 100; step++) {
    RSS(ref_smooth_tet_nso_step(ref_grid, node, &complete), "step");
    if (complete) break;
  }

  return REF_SUCCESS;
}